

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTests.cpp
# Opt level: O3

TestCaseGroup * vkt::image::createTests(TestContext *testCtx)

{
  TestGroupHelper0 *this;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"image","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Image tests","");
  this = (TestGroupHelper0 *)operator_new(0x78);
  TestGroupHelper0::TestGroupHelper0
            (this,testCtx,&local_40,&local_60,anon_unknown_1::createChildren);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return &this->super_TestCaseGroup;
}

Assistant:

tcu::TestCaseGroup* createTests (tcu::TestContext& testCtx)
{
	return createTestGroup(testCtx, "image", "Image tests", createChildren);
}